

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

char * __thiscall Imf_3_3::Context::fileName(Context *this)

{
  exr_result_t eVar1;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  char *filename;
  exr_const_context_t in_stack_fffffffffffffe48;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188 [376];
  char *local_10;
  
  local_10 = (char *)0x0;
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe50);
  eVar1 = exr_get_file_name(in_stack_fffffffffffffe48,(char **)0x15f408);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Unable to get filename from context");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,(stringstream *)in_stack_fffffffffffffe48);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

const char*
Context::fileName () const
{
    const char* filename = nullptr;

    if (EXR_ERR_SUCCESS != exr_get_file_name (*_ctxt, &filename))
    {
        THROW (IEX_NAMESPACE::ArgExc, "Unable to get filename from context");
    }

    return filename;
}